

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O2

int __thiscall squall::TableBase::call<int>(TableBase *this,string *name)

{
  int iVar1;
  
  iVar1 = detail::call<int>(this->vm_,&this->tableobj_,name);
  return iVar1;
}

Assistant:

R call(const string& name, T... args) {
        return detail::call<R>(vm_, tableobj_, name, args...);
    }